

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcmaster.c
# Opt level: O0

void finish_pass_master(j_compress_ptr cinfo)

{
  int iVar1;
  long lVar2;
  long in_RDI;
  my_master_ptr master;
  
  lVar2 = *(long *)(in_RDI + 0x1f0);
  (**(code **)(*(long *)(in_RDI + 0x230) + 0x10))();
  iVar1 = *(int *)(lVar2 + 0x20);
  if (iVar1 == 0) {
    *(undefined4 *)(lVar2 + 0x20) = 2;
    if (*(int *)(in_RDI + 0x128) == 0) {
      *(int *)(lVar2 + 0x2c) = *(int *)(lVar2 + 0x2c) + 1;
    }
  }
  else if (iVar1 == 1) {
    *(undefined4 *)(lVar2 + 0x20) = 2;
  }
  else if (iVar1 == 2) {
    if (*(int *)(in_RDI + 0x128) != 0) {
      *(undefined4 *)(lVar2 + 0x20) = 1;
    }
    *(int *)(lVar2 + 0x2c) = *(int *)(lVar2 + 0x2c) + 1;
  }
  *(int *)(lVar2 + 0x24) = *(int *)(lVar2 + 0x24) + 1;
  return;
}

Assistant:

METHODDEF(void)
finish_pass_master (j_compress_ptr cinfo)
{
  my_master_ptr master = (my_master_ptr) cinfo->master;

  /* The entropy coder always needs an end-of-pass call,
   * either to analyze statistics or to flush its output buffer.
   */
  (*cinfo->entropy->finish_pass) (cinfo);

  /* Update state for next pass */
  switch (master->pass_type) {
  case main_pass:
    /* next pass is either output of scan 0 (after optimization)
     * or output of scan 1 (if no optimization).
     */
    master->pass_type = output_pass;
    if (! cinfo->optimize_coding)
      master->scan_number++;
    break;
  case huff_opt_pass:
    /* next pass is always output of current scan */
    master->pass_type = output_pass;
    break;
  case output_pass:
    /* next pass is either optimization or output of next scan */
    if (cinfo->optimize_coding)
      master->pass_type = huff_opt_pass;
    master->scan_number++;
    break;
  }

  master->pass_number++;
}